

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

void __thiscall
gl4cts::FunctionObject::unary<tcu::Vector<double,_4>,_tcu::Vector<double,_4>_>::call
          (unary<tcu::Vector<double,_4>,_tcu::Vector<double,_4>_> *this,GLvoid *result_dst,
          GLvoid *argument_src)

{
  Vector<double,_4> arg;
  Vector<double,_4> result;
  Vector<double,_4> local_88;
  Vector<double,_4> local_68;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  tcu::Vector<double,_4>::Vector(&local_68);
  tcu::Vector<double,_4>::Vector(&local_88);
  local_88.m_data[0]._0_4_ = *argument_src;
  local_88.m_data[0]._4_4_ = *(undefined4 *)((long)argument_src + 4);
  local_88.m_data[1]._0_4_ = *(undefined4 *)((long)argument_src + 8);
  local_88.m_data[1]._4_4_ = *(undefined4 *)((long)argument_src + 0xc);
  local_88.m_data[2]._0_4_ = *(undefined4 *)((long)argument_src + 0x10);
  local_88.m_data[2]._4_4_ = *(undefined4 *)((long)argument_src + 0x14);
  local_88.m_data[3]._0_4_ = *(undefined4 *)((long)argument_src + 0x18);
  local_88.m_data[3]._4_4_ = *(undefined4 *)((long)argument_src + 0x1c);
  (*(code *)(this->super_unaryBase).super_functionObject.m_p_function)(&local_48,&local_88);
  *(undefined8 *)((long)result_dst + 0x10) = local_38;
  *(undefined8 *)((long)result_dst + 0x18) = uStack_30;
  *(undefined8 *)result_dst = local_48;
  *(undefined8 *)((long)result_dst + 8) = uStack_40;
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		ResT result;
		ArgT arg;

		unpack<ArgT>::get(argument_src, arg);

		functionPointer p_function = (functionPointer)m_p_function;

		result = p_function(arg);

		pack<ResT>::set(result_dst, result);
	}